

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

uint32_t bloaty::wasm::GetNumFunctionImports(Section *section)

{
  byte bVar1;
  uint32_t uVar2;
  Arg *this;
  int *in_RDI;
  uchar kind;
  uint32_t field_len;
  uint32_t module_len;
  uint32_t i;
  uint32_t func_count;
  uint32_t count;
  string_view data;
  string_view *in_stack_ffffffffffffff18;
  string_view *in_stack_ffffffffffffff20;
  char *__str;
  int value;
  Arg *in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff50;
  uint local_24;
  uint32_t local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if (*in_RDI == 2) {
    local_18 = *(undefined8 *)(in_RDI + 0xe);
    local_10 = *(undefined8 *)(in_RDI + 0x10);
    uVar2 = ReadVarUInt32((string_view *)0x1dc37a);
    local_20 = 0;
    for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
      __str = (char *)&local_18;
      ReadVarUInt32((string_view *)0x1dc3bd);
      ReadPiece((size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      ReadVarUInt32((string_view *)0x1dc3f1);
      ReadPiece((size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      bVar1 = ReadFixed<unsigned_char,1ul>(in_stack_ffffffffffffff20);
      this = (Arg *)(ulong)bVar1;
      switch(this) {
      case (Arg *)0x0:
        local_20 = local_20 + 1;
        ReadVarUInt32((string_view *)0x1dc472);
        break;
      case (Arg *)0x1:
        ReadTableType((string_view *)0x1dc484);
        break;
      case (Arg *)0x2:
        ReadMemoryType((string_view *)0x1dc496);
        break;
      case (Arg *)0x3:
        ReadGlobalType((string_view *)0x1dc4a8);
        break;
      default:
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)this,__str);
        value = (int)((ulong)__str >> 0x20);
        absl::substitute_internal::Arg::Arg(this,value);
        absl::Substitute_abi_cxx11_(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        std::__cxx11::string::c_str();
        Throw((char *)this,value);
      }
    }
    return local_20;
  }
  __assert_fail("section.id == Section::kImport",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/webassembly.cc"
                ,0x10f,"uint32_t bloaty::wasm::GetNumFunctionImports(const Section &)");
}

Assistant:

uint32_t GetNumFunctionImports(const Section& section) {
  assert(section.id == Section::kImport);
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);
  uint32_t func_count = 0;

  for (uint32_t i = 0; i < count; i++) {
    uint32_t module_len = ReadVarUInt32(&data);
    ReadPiece(module_len, &data);
    uint32_t field_len = ReadVarUInt32(&data);
    ReadPiece(field_len, &data);
    auto kind = ReadFixed<uint8_t>(&data);

    switch (kind) {
      case ExternalKind::kFunction:
        func_count++;
        ReadVarUInt32(&data);
        break;
      case ExternalKind::kTable:
        ReadTableType(&data);
        break;
      case ExternalKind::kMemory:
        ReadMemoryType(&data);
        break;
      case ExternalKind::kGlobal:
        ReadGlobalType(&data);
        break;
      default:
        THROWF("Unrecognized import kind: $0", kind);
    }
  }

  return func_count;
}